

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

int preparetocall(lua_State *L,TValue *func,TValue *err)

{
  StkId pTVar1;
  StkId pTVar2;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  StkId top;
  TValue *err_local;
  TValue *func_local;
  lua_State *L_local;
  
  pTVar1 = L->top;
  pTVar1->value_ = func->value_;
  pTVar1->tt_ = func->tt_;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                    ,0x6e,"int preparetocall(lua_State *, TValue *, TValue *)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0013f3a4:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                    ,0x6e,"int preparetocall(lua_State *, TValue *, TValue *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0x6e,"int preparetocall(lua_State *, TValue *, TValue *)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0013f3a4;
    }
  }
  if (err == (TValue *)0x0) {
    pTVar1[1].tt_ = 0;
  }
  else {
    pTVar2 = pTVar1 + 1;
    pTVar2->value_ = err->value_;
    pTVar1[1].tt_ = err->tt_;
    if ((pTVar1[1].tt_ & 0x8000) != 0) {
      if ((pTVar1[1].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0x70,"int preparetocall(lua_State *, TValue *, TValue *)");
      }
      if ((pTVar1[1].tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_0013f4c6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                      ,0x70,"int preparetocall(lua_State *, TValue *, TValue *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1[1].tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                        ,0x70,"int preparetocall(lua_State *, TValue *, TValue *)");
        }
        if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0013f4c6;
      }
    }
  }
  L->top = pTVar1 + 2;
  return 1;
}

Assistant:

static int preparetocall(lua_State *L, TValue *func, TValue *err) {
  StkId top = L->top;
  setobj2s(L, top, func);  /* will call deferred function */
  if (err) {
    setobj2s(L, top + 1, err); /* and error msg. as 1st argument */
  }
  else {
    setnilvalue(top + 1);
  }
  L->top = top + 2;  /* add function and arguments */
  return 1;
}